

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_106ef0::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  PixelType PVar1;
  bool bVar2;
  char cVar3;
  __type _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Box<Imath_3_2::Vec2<int>_> *pBVar9;
  Box<Imath_3_2::Vec2<int>_> *pBVar10;
  float *pfVar11;
  float *pfVar12;
  int *piVar13;
  ChannelList *this;
  ChannelList *pCVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TileDescription *this_00;
  TileDescription *other;
  ulong uVar15;
  ostream *poVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  void **ppvVar23;
  int iVar24;
  char *pcVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int i;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  PixelType PVar35;
  long lVar36;
  int iVar37;
  char *pcVar38;
  int iVar39;
  int k;
  ulong uVar40;
  int j;
  uint uVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  float fVar45;
  float fVar46;
  int local_34c;
  long local_348;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int local_310;
  Array2D<unsigned_int> localSampleCount;
  DeepTiledInputFile file;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  string str;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [376];
  
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1b6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  Imf_3_2::DeepTiledInputFile::header();
  pBVar9 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  pBVar10 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar9,pBVar10);
  if (!bVar2) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bd,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pBVar9 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  pBVar10 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar9,pBVar10);
  if (!bVar2) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1be,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar46 = *pfVar11;
  pfVar11 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar46 != *pfVar11) || (NAN(fVar46) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bf,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = (float *)Imf_3_2::Header::screenWindowCenter();
  pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
  if ((((*pfVar11 != *pfVar12) || (NAN(*pfVar11) || NAN(*pfVar12))) || (pfVar11[1] != pfVar12[1]))
     || (NAN(pfVar11[1]) || NAN(pfVar12[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar46 = *pfVar11;
  pfVar11 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar46 != *pfVar11) || (NAN(fVar46) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar13 = (int *)Imf_3_2::Header::lineOrder();
  iVar44 = *piVar13;
  piVar13 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar44 != *piVar13) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar13 = (int *)Imf_3_2::Header::compression();
  iVar44 = *piVar13;
  piVar13 = (int *)Imf_3_2::Header::compression();
  if (iVar44 != *piVar13) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = (ChannelList *)Imf_3_2::Header::channels();
  pCVar14 = (ChannelList *)Imf_3_2::Header::channels();
  cVar3 = Imf_3_2::ChannelList::operator==(this,pCVar14);
  if (cVar3 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c4,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Imf_3_2::Header::type_abi_cxx11_();
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Imf_3_2::Header::type_abi_cxx11_();
  _Var4 = std::operator==(__lhs,__rhs);
  if (!_Var4) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c5,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this_00 = (TileDescription *)Imf_3_2::Header::tileDescription();
  other = (TileDescription *)Imf_3_2::Header::tileDescription();
  bVar2 = Imf_3_2::TileDescription::operator==(this_00,other);
  if (!bVar2) {
    __assert_fail("fileHeader.tileDescription () == header.tileDescription ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  localSampleCount._sizeX = 0;
  localSampleCount._sizeY = 0;
  localSampleCount._data = (uint *)0x0;
  Imf_3_2::Array2D<unsigned_int>::resizeErase(&localSampleCount,0xa9,0x111);
  uVar5 = random_int(3);
  uVar41 = uVar5 + channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)(int)uVar41);
  uVar31 = 0;
  uVar15 = (ulong)uVar41;
  if ((int)uVar41 < 1) {
    uVar15 = uVar31;
  }
  for (; uVar15 * 0x18 - uVar31 != 0; uVar31 = uVar31 + 0x18) {
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + uVar31),0xa9,0x111);
  }
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  if (relativeCoords) {
    lVar36 = 0;
  }
  else {
    lVar36 = (long)DAT_001d75c4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,(char *)(localSampleCount._data + -lVar36),4,0x444,1,1,0.0,
             relativeCoords,relativeCoords);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  std::vector<int,_std::allocator<int>_>::vector
            (&read_channel,(ulong)(uint)channelCount,(allocator_type *)&ss);
  uVar31 = 0;
  uVar15 = 0;
  if (0 < channelCount) {
    uVar15 = (ulong)(uint)channelCount;
  }
  lVar32 = 0x10;
  iVar44 = 0;
  do {
    if (uVar15 == uVar31) {
      if (iVar44 == 0) {
        std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::flush();
      }
      else {
        uVar40 = 0;
        uVar31 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar31 = uVar40;
        }
        lVar32 = (long)channelCount * 0x18;
        for (; uVar31 != uVar40; uVar40 = uVar40 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar16 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar40);
          std::operator<<(poVar16,"fill");
          std::__cxx11::stringbuf::str();
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar32) + lVar36 * -8),8,0x888,
                     4,1,1,0.0,relativeCoords,relativeCoords);
          Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          lVar32 = lVar32 + 0x18;
        }
        Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
        pcVar25 = "per-tile ";
        if (relativeCoords) {
          pcVar25 = "per-tile with relative coordinates ";
        }
        pcVar38 = "bulk ";
        if (!bulkRead) {
          pcVar38 = pcVar25;
        }
        std::operator<<((ostream *)&std::cout,pcVar38);
        std::ostream::flush();
        lVar36 = uVar31 * 0x18;
        for (local_348 = 0; iVar44 = Imf_3_2::DeepTiledInputFile::numYLevels(), local_348 < iVar44;
            local_348 = local_348 + 1) {
          lVar32 = 0;
          while( true ) {
            iVar44 = Imf_3_2::DeepTiledInputFile::numXLevels();
            if (iVar44 <= lVar32) break;
            iVar44 = (int)&file;
            Imf_3_2::DeepTiledInputFile::dataWindowForLevel((int)&ss,iVar44);
            iVar6 = (int)lVar32;
            if (bulkRead) {
              iVar7 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar44);
              iVar8 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar44);
              Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
                        (iVar44,0,iVar7 + -1,0,iVar8 + -1,iVar6);
              local_34c = 0;
              while( true ) {
                iVar7 = (int)&file;
                iVar44 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar7);
                if (iVar44 <= local_34c) break;
                iVar44 = 0;
                while( true ) {
                  iVar7 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file);
                  if (iVar7 <= iVar44) break;
                  Imf_3_2::DeepTiledInputFile::dataWindowForTile
                            ((int)&box,(int)&file,iVar44,local_34c);
                  iVar7 = box.max.y;
                  lVar26 = (long)box.min.x;
                  lVar27 = (long)box.max.x;
                  for (iVar8 = box.min.y; iVar8 <= iVar7; iVar8 = iVar8 + 1) {
                    lVar42 = (long)iVar8 - (long)local_1b4;
                    lVar17 = (long)_ss;
                    lVar18 = localSampleCount._sizeY * lVar42;
                    lVar19 = DAT_001d7600 * local_348;
                    for (lVar21 = lVar26; lVar21 <= lVar27; lVar21 = lVar21 + 1) {
                      lVar33 = lVar21 - lVar17;
                      lVar28 = DAT_001d7608 + lVar19 * 0x18;
                      if (localSampleCount._data[lVar18 + lVar33] !=
                          *(uint *)(*(long *)(lVar32 * 0x18 + 8 + lVar28) * lVar42 * 4 +
                                    *(long *)(lVar32 * 0x18 + 0x10 + lVar28) + lVar33 * 4)) {
                        __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                      ,0x253,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar28 = 4;
                      lVar34 = (anonymous_namespace)::channelTypes;
                      for (uVar31 = 0; uVar31 < (ulong)(DAT_001d75e8 - lVar34 >> 2);
                          uVar31 = uVar31 + 1) {
                        iVar29 = *(int *)(lVar34 + uVar31 * 4);
                        if (iVar29 == 0) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          iVar29 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar29 == 1) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] *
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          iVar29 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar29 == 2) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        lVar28 = lVar28 + 6;
                      }
                      for (lVar28 = 0; lVar36 - lVar28 != 0; lVar28 = lVar28 + 0x18) {
                        pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] << 2
                                                );
                        uVar31 = (ulong)(DAT_001d75e8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar31]._sizeY + lVar28) * lVar42 * 8
                                   + *(long *)((long)&data._data[uVar31]._data + lVar28) +
                                  lVar33 * 8) = pvVar20;
                      }
                    }
                  }
                  iVar44 = iVar44 + 1;
                }
                local_34c = local_34c + 1;
              }
              iVar44 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar7);
              iVar8 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar7);
              Imf_3_2::DeepTiledInputFile::readTiles(iVar7,0,iVar44 + -1,0,iVar8 + -1,iVar6);
            }
            else if (relativeCoords) {
              for (local_310 = 0; iVar44 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file),
                  local_310 < iVar44; local_310 = local_310 + 1) {
                iVar44 = 0;
                while( true ) {
                  iVar8 = (int)&file;
                  iVar7 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar8);
                  if (iVar7 <= iVar44) break;
                  Imf_3_2::DeepTiledInputFile::readPixelSampleCount(iVar8,iVar44,local_310,iVar6);
                  Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&box,iVar8,iVar44,local_310);
                  lVar21 = (long)box.max.y;
                  lVar17 = (long)box.min.x;
                  lVar18 = (long)box.max.x;
                  lVar27 = (long)box.min.y;
                  for (lVar26 = lVar27; lVar26 <= lVar21; lVar26 = lVar26 + 1) {
                    lVar42 = (long)_ss;
                    lVar34 = lVar26 - lVar27;
                    lVar28 = localSampleCount._sizeY * lVar34;
                    lVar33 = DAT_001d7600 * local_348;
                    for (lVar19 = lVar17; lVar19 <= lVar18; lVar19 = lVar19 + 1) {
                      lVar43 = lVar19 - lVar17;
                      lVar30 = DAT_001d7608 + lVar33 * 0x18;
                      if (localSampleCount._data[lVar28 + lVar43] !=
                          *(uint *)(*(long *)(lVar32 * 0x18 + 8 + lVar30) * (lVar26 - local_1b4) * 4
                                    + *(long *)(lVar32 * 0x18 + 0x10 + lVar30) +
                                   (lVar19 - lVar42) * 4)) {
                        __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                      ,0x2be,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar30 = 4;
                      lVar22 = (anonymous_namespace)::channelTypes;
                      for (uVar31 = 0; uVar31 < (ulong)(DAT_001d75e8 - lVar22 >> 2);
                          uVar31 = uVar31 + 1) {
                        if ((!randomChannels) ||
                           (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar31] == 1)) {
                          iVar7 = *(int *)(lVar22 + uVar31 * 4);
                          if (iVar7 == 0) {
                            pvVar20 = operator_new__((ulong)localSampleCount._data[lVar28 + lVar43]
                                                     << 2);
                            *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar34 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar43 * 8) = pvVar20;
                            iVar7 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                            lVar22 = (anonymous_namespace)::channelTypes;
                          }
                          if (iVar7 == 1) {
                            pvVar20 = operator_new__((ulong)localSampleCount._data[lVar28 + lVar43]
                                                     * 2);
                            *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar34 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar43 * 8) = pvVar20;
                            lVar22 = (anonymous_namespace)::channelTypes;
                          }
                          if (*(int *)(lVar22 + uVar31 * 4) == 2) {
                            pvVar20 = operator_new__((ulong)localSampleCount._data[lVar28 + lVar43]
                                                     << 2);
                            *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar34 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar43 * 8) = pvVar20;
                            lVar22 = (anonymous_namespace)::channelTypes;
                          }
                        }
                        lVar30 = lVar30 + 6;
                      }
                      for (lVar30 = 0; lVar36 - lVar30 != 0; lVar30 = lVar30 + 0x18) {
                        pvVar20 = operator_new__((ulong)localSampleCount._data[lVar28 + lVar43] << 2
                                                );
                        uVar31 = (ulong)(DAT_001d75e8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar31]._sizeY + lVar30) * lVar34 * 8
                                   + *(long *)((long)&data._data[uVar31]._data + lVar30) +
                                  lVar43 * 8) = pvVar20;
                      }
                    }
                  }
                  Imf_3_2::DeepTiledInputFile::readTile((int)&file,iVar44,local_310,iVar6);
                  for (iVar7 = box.min.y; iVar8 = box.min.x, iVar7 <= box.max.y; iVar7 = iVar7 + 1)
                  {
                    for (; iVar8 <= box.max.x; iVar8 = iVar8 + 1) {
                      iVar37 = iVar7 - local_1b4;
                      iVar39 = iVar8 - _ss;
                      lVar21 = (long)iVar7 - (long)box.min.y;
                      iVar29 = (iVar37 * 0x111 + iVar39) % 0x801;
                      fVar46 = (float)iVar29;
                      lVar27 = (long)iVar8 - (long)box.min.x;
                      lVar26 = (anonymous_namespace)::channelTypes;
                      for (uVar31 = 0; uVar31 < (ulong)(DAT_001d75e8 - lVar26 >> 2);
                          uVar31 = uVar31 + 1) {
                        if ((!randomChannels) ||
                           (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar31] == 1)) {
                          pvVar20 = data._data[uVar31]._data
                                    [data._data[uVar31]._sizeY * lVar21 + lVar27];
                          iVar24 = *(int *)(lVar26 + uVar31 * 4);
                          uVar5 = localSampleCount._data[localSampleCount._sizeY * lVar21 + lVar27];
                          if ((int)localSampleCount._data[localSampleCount._sizeY * lVar21 + lVar27]
                              < 1) {
                            uVar5 = 0;
                          }
                          for (uVar40 = 0; uVar5 != uVar40; uVar40 = uVar40 + 1) {
                            if (iVar24 == 2) {
                              fVar45 = *(float *)((long)pvVar20 + uVar40 * 4);
                              if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                                poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar39);
                                poVar16 = std::operator<<(poVar16,", ");
                                poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                                poVar16 = std::operator<<(poVar16," error, should be ");
                                poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar29);
                                poVar16 = std::operator<<(poVar16,", is ");
                                poVar16 = (ostream *)
                                          std::ostream::operator<<
                                                    (poVar16,*(float *)((long)pvVar20 + uVar40 * 4))
                                ;
                                std::endl<char,std::char_traits<char>>(poVar16);
                                std::ostream::flush();
                                fVar45 = *(float *)((long)pvVar20 + uVar40 * 4);
                              }
                              if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                                __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                              ,0x1a9,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                            else if (iVar24 == 1) {
                              fVar45 = *(float *)(_imath_half_to_float_table +
                                                 (ulong)*(ushort *)((long)pvVar20 + uVar40 * 2) * 4)
                              ;
                              if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                                poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar39);
                                poVar16 = std::operator<<(poVar16,", ");
                                poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                                poVar16 = std::operator<<(poVar16," error, should be ");
                                poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar29);
                                poVar16 = std::operator<<(poVar16,", is ");
                                poVar16 = (ostream *)
                                          ::operator<<(poVar16,(half)*(uint16_t *)
                                                                      ((long)pvVar20 + uVar40 * 2));
                                std::endl<char,std::char_traits<char>>(poVar16);
                                std::ostream::flush();
                                fVar45 = *(float *)(_imath_half_to_float_table +
                                                   (ulong)*(ushort *)((long)pvVar20 + uVar40 * 2) *
                                                   4);
                              }
                              if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                                __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                              ,0x19f,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                            else if ((iVar24 == 0) &&
                                    (*(int *)((long)pvVar20 + uVar40 * 4) != iVar29)) {
                              poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar39);
                              poVar16 = std::operator<<(poVar16,", ");
                              poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                              poVar16 = std::operator<<(poVar16," error, should be ");
                              poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar29);
                              poVar16 = std::operator<<(poVar16,", is ");
                              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                              std::endl<char,std::char_traits<char>>(poVar16);
                              std::ostream::flush();
                              if (*(int *)((long)pvVar20 + uVar40 * 4) != iVar29) {
                                __assert_fail("value[l] == static_cast<unsigned int> ((dwy * width + dwx) % 2049)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                              ,0x195,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                          }
                          iVar24 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          if (iVar24 == 0) {
                            lVar26 = (anonymous_namespace)::channelTypes;
                            if (data._data[uVar31]._data
                                [data._data[uVar31]._sizeY * lVar21 + lVar27] == (void *)0x0)
                            goto LAB_0014c108;
                            operator_delete__(data._data[uVar31]._data
                                              [data._data[uVar31]._sizeY * lVar21 + lVar27]);
                            iVar24 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          }
                          if (iVar24 == 1) {
                            lVar26 = (anonymous_namespace)::channelTypes;
                            if (data._data[uVar31]._data
                                [data._data[uVar31]._sizeY * lVar21 + lVar27] == (void *)0x0)
                            goto LAB_0014c108;
                            operator_delete__(data._data[uVar31]._data
                                              [data._data[uVar31]._sizeY * lVar21 + lVar27]);
                            iVar24 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          }
                          lVar26 = (anonymous_namespace)::channelTypes;
                          if ((iVar24 == 2) &&
                             (data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar21 + lVar27]
                              != (void *)0x0)) {
                            operator_delete__(data._data[uVar31]._data
                                              [data._data[uVar31]._sizeY * lVar21 + lVar27]);
                            lVar26 = (anonymous_namespace)::channelTypes;
                          }
                        }
LAB_0014c108:
                      }
                      for (lVar26 = 0; lVar36 - lVar26 != 0; lVar26 = lVar26 + 0x18) {
                        uVar31 = (ulong)(DAT_001d75e8 - (anonymous_namespace)::channelTypes) >> 2;
                        pvVar20 = *(void **)(*(long *)((long)&data._data[uVar31]._sizeY + lVar26) *
                                             lVar21 * 8 +
                                             *(long *)((long)&data._data[uVar31]._data + lVar26) +
                                            lVar27 * 8);
                        if (pvVar20 != (void *)0x0) {
                          operator_delete__(pvVar20);
                        }
                      }
                    }
                  }
                  iVar44 = iVar44 + 1;
                }
              }
            }
            else {
              for (local_34c = 0; iVar44 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file),
                  local_34c < iVar44; local_34c = local_34c + 1) {
                iVar44 = 0;
                while( true ) {
                  iVar8 = (int)&file;
                  iVar7 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar8);
                  if (iVar7 <= iVar44) break;
                  Imf_3_2::DeepTiledInputFile::readPixelSampleCount(iVar8,iVar44,local_34c,iVar6);
                  Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&box,iVar8,iVar44,local_34c);
                  iVar7 = box.max.y;
                  lVar26 = (long)box.min.x;
                  lVar27 = (long)box.max.x;
                  for (iVar8 = box.min.y; iVar8 <= iVar7; iVar8 = iVar8 + 1) {
                    lVar42 = (long)iVar8 - (long)local_1b4;
                    lVar17 = (long)_ss;
                    lVar18 = localSampleCount._sizeY * lVar42;
                    lVar19 = DAT_001d7600 * local_348;
                    for (lVar21 = lVar26; lVar21 <= lVar27; lVar21 = lVar21 + 1) {
                      lVar33 = lVar21 - lVar17;
                      lVar28 = DAT_001d7608 + lVar19 * 0x18;
                      if (localSampleCount._data[lVar18 + lVar33] !=
                          *(uint *)(*(long *)(lVar32 * 0x18 + 8 + lVar28) * lVar42 * 4 +
                                    *(long *)(lVar32 * 0x18 + 0x10 + lVar28) + lVar33 * 4)) {
                        __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                      ,0x28c,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar28 = 4;
                      lVar34 = (anonymous_namespace)::channelTypes;
                      for (uVar31 = 0; uVar31 < (ulong)(DAT_001d75e8 - lVar34 >> 2);
                          uVar31 = uVar31 + 1) {
                        iVar29 = *(int *)(lVar34 + uVar31 * 4);
                        if (iVar29 == 0) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          iVar29 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar29 == 1) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] *
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          iVar29 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar29 == 2) {
                          pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar42 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                    lVar33 * 8) = pvVar20;
                          lVar34 = (anonymous_namespace)::channelTypes;
                        }
                        lVar28 = lVar28 + 6;
                      }
                      for (lVar28 = 0; lVar36 - lVar28 != 0; lVar28 = lVar28 + 0x18) {
                        pvVar20 = operator_new__((ulong)localSampleCount._data[lVar18 + lVar33] << 2
                                                );
                        uVar31 = (ulong)(DAT_001d75e8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar31]._sizeY + lVar28) * lVar42 * 8
                                   + *(long *)((long)&data._data[uVar31]._data + lVar28) +
                                  lVar33 * 8) = pvVar20;
                      }
                    }
                  }
                  Imf_3_2::DeepTiledInputFile::readTile((int)&file,iVar44,local_34c,iVar6);
                  iVar44 = iVar44 + 1;
                }
              }
            }
            if (!relativeCoords) {
              lVar26 = 0;
              while( true ) {
                iVar44 = Imf_3_2::DeepTiledInputFile::levelHeight((int)&file);
                iVar6 = (int)lVar26;
                if (iVar44 <= lVar26) break;
                for (lVar27 = 0; iVar44 = Imf_3_2::DeepTiledInputFile::levelWidth((int)&file),
                    lVar27 < iVar44; lVar27 = lVar27 + 1) {
                  iVar44 = (int)lVar27;
                  uVar5 = (uint)(iVar6 * 0x111 + iVar44) % 0x801;
                  fVar46 = (float)uVar5;
                  for (uVar31 = 0; uVar31 != uVar15; uVar31 = uVar31 + 1) {
                    if ((!randomChannels) ||
                       (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar31] == 1)) {
                      for (uVar40 = 0;
                          uVar40 < localSampleCount._data[localSampleCount._sizeY * lVar26 + lVar27]
                          ; uVar40 = uVar40 + 1) {
                        iVar7 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                        if (iVar7 == 0) {
                          pvVar20 = data._data[uVar31]._data
                                    [data._data[uVar31]._sizeY * lVar26 + lVar27];
                          if (*(uint *)((long)pvVar20 + uVar40 * 4) != uVar5) {
                            poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar44);
                            poVar16 = std::operator<<(poVar16,", ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
                            poVar16 = std::operator<<(poVar16," error, should be ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar5);
                            poVar16 = std::operator<<(poVar16,", is ");
                            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                            std::endl<char,std::char_traits<char>>(poVar16);
                            std::ostream::flush();
                            if (*(uint *)((long)pvVar20 + uVar40 * 4) != uVar5) {
                              __assert_fail("value[l] == static_cast<unsigned int> ( i * width + j) % 2049"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                            ,0x323,
                                            "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                           );
                            }
                          }
                          iVar7 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                        }
                        if (iVar7 == 1) {
                          ppvVar23 = data._data[uVar31]._data;
                          lVar21 = data._data[uVar31]._sizeY * lVar26;
                          pvVar20 = ppvVar23[lVar21 + lVar27];
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)((long)pvVar20 + uVar40 * 2) * 4);
                          if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                            poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar44);
                            poVar16 = std::operator<<(poVar16,", ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
                            poVar16 = std::operator<<(poVar16," error, should be ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar5);
                            poVar16 = std::operator<<(poVar16,", is ");
                            poVar16 = (ostream *)
                                      ::operator<<(poVar16,(half)*(uint16_t *)
                                                                  ((long)pvVar20 + uVar40 * 2));
                            std::endl<char,std::char_traits<char>>(poVar16);
                            std::ostream::flush();
                            ppvVar23 = data._data[uVar31]._data;
                            lVar21 = data._data[uVar31]._sizeY * lVar26;
                          }
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)
                                                     ((long)ppvVar23[lVar21 + lVar27] + uVar40 * 2)
                                             * 4);
                          if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                            __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x330,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          iVar7 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                        }
                        if (iVar7 == 2) {
                          ppvVar23 = data._data[uVar31]._data;
                          lVar21 = data._data[uVar31]._sizeY * lVar26;
                          pvVar20 = ppvVar23[lVar21 + lVar27];
                          fVar45 = *(float *)((long)pvVar20 + uVar40 * 4);
                          if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                            poVar16 = (ostream *)std::ostream::operator<<(&std::cout,iVar44);
                            poVar16 = std::operator<<(poVar16,", ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar6);
                            poVar16 = std::operator<<(poVar16," error, should be ");
                            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar5);
                            poVar16 = std::operator<<(poVar16,", is ");
                            poVar16 = (ostream *)
                                      std::ostream::operator<<
                                                (poVar16,*(float *)((long)pvVar20 + uVar40 * 4));
                            std::endl<char,std::char_traits<char>>(poVar16);
                            std::ostream::flush();
                            ppvVar23 = data._data[uVar31]._data;
                            lVar21 = data._data[uVar31]._sizeY * lVar26;
                          }
                          fVar45 = *(float *)((long)ppvVar23[lVar21 + lVar27] + uVar40 * 4);
                          if ((fVar45 != fVar46) || (NAN(fVar45) || NAN(fVar46))) {
                            __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x33d,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
                lVar26 = lVar26 + 1;
              }
              for (lVar26 = 0; iVar44 = Imf_3_2::DeepTiledInputFile::levelHeight((int)&file),
                  lVar26 < iVar44; lVar26 = lVar26 + 1) {
                for (lVar27 = 0; iVar44 = Imf_3_2::DeepTiledInputFile::levelWidth((int)&file),
                    lVar27 < iVar44; lVar27 = lVar27 + 1) {
                  lVar21 = 4;
                  for (uVar31 = 0; uVar15 != uVar31; uVar31 = uVar31 + 1) {
                    iVar44 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                    if (iVar44 == 0) {
                      pvVar20 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar26 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                          lVar27 * 8);
                      if (pvVar20 != (void *)0x0) {
                        operator_delete__(pvVar20);
                        iVar44 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                        goto LAB_0014c8e9;
                      }
                    }
                    else {
LAB_0014c8e9:
                      if (iVar44 == 1) {
                        pvVar20 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar26
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar21 * 4) + lVar27 * 8);
                        if (pvVar20 == (void *)0x0) goto LAB_0014c946;
                        operator_delete__(pvVar20);
                        iVar44 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                      }
                      if ((iVar44 == 2) &&
                         (pvVar20 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) *
                                               lVar26 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                              lVar27 * 8), pvVar20 != (void *)0x0)) {
                        operator_delete__(pvVar20);
                      }
                    }
LAB_0014c946:
                    lVar21 = lVar21 + 6;
                  }
                  for (lVar21 = 0; lVar36 - lVar21 != 0; lVar21 = lVar21 + 0x18) {
                    uVar31 = (ulong)(DAT_001d75e8 - (anonymous_namespace)::channelTypes) >> 2;
                    pvVar20 = *(void **)(*(long *)((long)&data._data[uVar31]._sizeY + lVar21) *
                                         lVar26 * 8 +
                                         *(long *)((long)&data._data[uVar31]._data + lVar21) +
                                        lVar27 * 8);
                    if (pvVar20 != (void *)0x0) {
                      operator_delete__(pvVar20);
                    }
                  }
                }
              }
            }
            lVar32 = lVar32 + 1;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&read_channel.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      Imf_3_2::Array2D<unsigned_int>::~Array2D(&localSampleCount);
      Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile(&file);
      return;
    }
    if (randomChannels) {
      iVar6 = random_int(2);
      read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar31] = iVar6;
      if (iVar6 == 1) goto LAB_0014b435;
    }
    else {
LAB_0014b435:
      PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar31 * 4);
      PVar35 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar35 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar35 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar31);
      std::__cxx11::stringbuf::str();
      iVar6 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
      uVar40 = (ulong)(iVar6 == 0) << 2;
      if (iVar6 == 1) {
        uVar40 = 2;
      }
      if (iVar6 == 2) {
        uVar40 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)&box,PVar35,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar32) + lVar36 * -8),8,0x888,
                 uVar40,1,1,0.0,relativeCoords,relativeCoords);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
      iVar44 = iVar44 + 1;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar31 = uVar31 + 1;
    lVar32 = lVar32 + 0x18;
  } while( true );
}

Assistant:

void
readFile (
    int                channelCount,
    bool               bulkRead,
    bool               relativeCoords,
    bool               randomChannels,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str (), 4);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());
    assert (fileHeader.tileDescription () == header.tileDescription ());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&localSampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    vector<int> read_channel (channelCount);
    int         channels_added = 0;
    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str,
                DeepSlice (
                    type,
                    (char*) (&data[i][0][0] - memOffset),
                    pointerSize * 1,
                    pointerSize * width,
                    sampleSize,
                    1,
                    1,
                    0,
                    relativeCoords,
                    relativeCoords));
            channels_added++;
        }
    }
    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i + channelCount][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);

                for (int i = 0; i < file.numYTiles (ly); i++)
                {
                    for (int j = 0; j < file.numXTiles (lx); j++)
                    {
                        Box2i box = file.dataWindowForTile (j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert (
                                    localSampleCount[dwy][dwx] ==
                                    sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size ();
                                     k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int
                                            [localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[localSampleCount[dwy]
                                                                     [dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[localSampleCount[dwy]
                                                                      [dwx]];
                                }

                                for (int f = 0; f < fillChannels; ++f)
                                {
                                    data[f + channelTypes.size ()][dwy][dwx] =
                                        new float[localSampleCount[dwy][dwx]];
                                }
                            }
                    }
                }

                file.readTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert (
                                        localSampleCount[dwy][dwx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[localSampleCount[dwy]
                                                                         [dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][dwy]
                                            [dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;
                                    assert (
                                        localSampleCount[ty][tx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            if (channelTypes[k] == 0)
                                                data[k][ty][tx] =
                                                    new unsigned int
                                                        [localSampleCount[ty]
                                                                         [tx]];
                                            if (channelTypes[k] == 1)
                                                data[k][ty][tx] = new half
                                                    [localSampleCount[ty][tx]];
                                            if (channelTypes[k] == 2)
                                                data[k][ty][tx] = new float
                                                    [localSampleCount[ty][tx]];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][ty][tx] =
                                            new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            checkValue (
                                                data[k][ty][tx],
                                                localSampleCount[ty][tx],
                                                channelTypes[k],
                                                dwx,
                                                dwy);
                                            if (channelTypes[k] == 0)
                                                delete[](unsigned int*)
                                                    data[k][ty][tx];
                                            if (channelTypes[k] == 1)
                                                delete[](half*) data[k][ty][tx];
                                            if (channelTypes[k] == 2)
                                                delete[](float*)
                                                    data[k][ty][tx];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        delete[](float*)
                                            data[f + channelTypes.size ()][ty]
                                                [tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (!randomChannels || read_channel[k] == 1)
                            {
                                for (unsigned int l = 0;
                                     l < localSampleCount[i][j];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value =
                                            (unsigned int*) (data[k][i][j]);
                                        if (value[l] !=
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            value[l] ==
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((half*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((float*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
                        for (int f = 0; f < fillChannels; ++f)
                        {
                            delete[](float*)
                                data[f + channelTypes.size ()][i][j];
                        }
                    }
            }
        }
}